

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

Token * __thiscall
EOPlus::Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
::xGetToken(Token *__return_storage_ptr__,
           Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
           *this)

{
  undefined1 local_70 [64];
  _Self local_30;
  
  if ((this->it)._M_cur == (this->end)._M_cur) {
    util::variant::variant((variant *)local_70);
    Token::Token(__return_storage_ptr__,Invalid,(variant *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x10));
  }
  else {
    std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>::operator++
              (&local_30,&this->it,0);
    Token::Token(__return_storage_ptr__,local_30._M_cur);
  }
  return __return_storage_ptr__;
}

Assistant:

Token xGetToken()
			{
				if (it == end)
					return Token();

				return *(it++);
			}